

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ChainPromiseNode::traceEvent(ChainPromiseNode *this,TraceBuilder *builder)

{
  PromiseNode *pPVar1;
  Event *pEVar2;
  
  if (this->state == STEP1) {
    pPVar1 = (this->inner).ptr;
    if (pPVar1 != (PromiseNode *)0x0) {
      (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,1);
    }
    if ((builder->current != builder->limit) &&
       (pEVar2 = this->onReadyEvent, pEVar2 != (Event *)0x0)) {
      (**pEVar2->_vptr_Event)(pEVar2,builder);
      return;
    }
  }
  return;
}

Assistant:

void ChainPromiseNode::traceEvent(TraceBuilder& builder) {
  switch (state) {
    case STEP1:
      if (inner.get() != nullptr) {
        inner->tracePromise(builder, true);
      }
      if (!builder.full() && onReadyEvent != nullptr) {
        onReadyEvent->traceEvent(builder);
      }
      break;
    case STEP2:
      // This probably never happens -- a trace being generated after the meat of fire() already
      // executed. If it does, though, we probably can't do anything here. We don't know if
      // `onReadyEvent` is still valid because we passed it on to the phase-2 promise, and tracing
      // just `inner` would probably be confusing. Let's just do nothing.
      break;
  }
}